

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

DSPOMDP * __thiscall MyPlanner::InitializeModel(MyPlanner *this,Option *options)

{
  long lVar1;
  Navigation *this_00;
  allocator<char> local_39;
  string local_38;
  
  lVar1 = *(long *)(options + 0x70);
  this_00 = (Navigation *)operator_new(0x110);
  if (lVar1 == 0) {
    despot::Navigation::Navigation(this_00);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,*(char **)(options + 0x80),&local_39);
    despot::Navigation::Navigation(this_00,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return &this_00->super_DSPOMDP;
}

Assistant:

DSPOMDP* InitializeModel(option::Option* options) {
    DSPOMDP* model = !options[E_PARAMS_FILE] ?
      new Navigation() : new Navigation(options[E_PARAMS_FILE].arg);
    return model;
  }